

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

char __thiscall Fl_Preferences::get(Fl_Preferences *this,char *key,char **text,char *defaultValue)

{
  char *pcVar1;
  char *local_38;
  char *v;
  char *defaultValue_local;
  char **text_local;
  char *key_local;
  Fl_Preferences *this_local;
  
  local_38 = Node::get(this->node,key);
  if ((local_38 != (char *)0x0) && (pcVar1 = strchr(local_38,0x5c), pcVar1 != (char *)0x0)) {
    pcVar1 = decodeText(local_38);
    *text = pcVar1;
    return '\x01';
  }
  if (local_38 == (char *)0x0) {
    local_38 = defaultValue;
  }
  if (local_38 == (char *)0x0) {
    *text = (char *)0x0;
  }
  else {
    pcVar1 = strdup(local_38);
    *text = pcVar1;
  }
  return local_38 != defaultValue;
}

Assistant:

char Fl_Preferences::get( const char *key, char *&text, const char *defaultValue ) {
  const char *v = node->get( key );
  if ( v && strchr( v, '\\' ) ) {
    text = decodeText( v );
    return 1;
  }
  if ( !v ) v = defaultValue;
  if ( v )
    text = strdup( v );
  else
    text = 0;
  return ( v != defaultValue );
}